

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O0

ConversionResult
convertUTF::ConvertUTF32toUTF8
          (UTF32 **sourceStart,UTF32 *sourceEnd,UTF8 **targetStart,UTF8 *targetEnd,
          ConversionFlags flags)

{
  uint local_48;
  ushort local_42;
  UTF32 ch;
  unsigned_short bytesToWrite;
  UTF8 *target;
  UTF32 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF8 *targetEnd_local;
  UTF8 **targetStart_local;
  UTF32 *sourceEnd_local;
  UTF32 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  _ch = *targetStart;
  target = (UTF8 *)*sourceStart;
  do {
    if (sourceEnd <= target) {
LAB_002954ce:
      *sourceStart = (UTF32 *)target;
      *targetStart = _ch;
      return (ConversionResult)source;
    }
    local_48 = *(uint *)target;
    if (((flags == strictConversion) && (0xd7ff < local_48)) && (local_48 < 0xe000)) {
      source._0_4_ = sourceIllegal;
      goto LAB_002954ce;
    }
    if (local_48 < 0x80) {
      local_42 = 1;
    }
    else if (local_48 < 0x800) {
      local_42 = 2;
    }
    else if (local_48 < 0x10000) {
      local_42 = 3;
    }
    else if (local_48 < 0x110000) {
      local_42 = 4;
    }
    else {
      local_42 = 3;
      local_48 = 0xfffd;
      source._0_4_ = sourceIllegal;
    }
    _ch = _ch + (int)(uint)local_42;
    if (targetEnd < _ch) {
      _ch = _ch + -(long)(int)(uint)local_42;
      source._0_4_ = targetExhausted;
      goto LAB_002954ce;
    }
    switch(local_42) {
    case 4:
      _ch[-1] = (byte)local_48 & 0xbf | 0x80;
      local_48 = local_48 >> 6;
      _ch = _ch + -1;
    case 3:
      _ch[-1] = (byte)local_48 & 0xbf | 0x80;
      local_48 = local_48 >> 6;
      _ch = _ch + -1;
    case 2:
      _ch[-1] = (byte)local_48 & 0xbf | 0x80;
      local_48 = local_48 >> 6;
      _ch = _ch + -1;
    case 1:
      _ch[-1] = (byte)local_48 | *(byte *)((long)&firstByteMark + (ulong)local_42);
      _ch = _ch + -1;
    default:
      _ch = _ch + (int)(uint)local_42;
      target = target + 4;
    }
  } while( true );
}

Assistant:

ConversionResult ConvertUTF32toUTF8(const UTF32** sourceStart, const UTF32* sourceEnd, UTF8** targetStart,
                                    const UTF8* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF32* source = *sourceStart;
    UTF8* target = *targetStart;
    while (source < sourceEnd)
    {
        unsigned short bytesToWrite;
        static constexpr UTF32 byteMask = 0xBF;
        static constexpr UTF32 byteMark = 0x80;
        UTF32 ch = *source++;
        if (flags == ConversionFlags::strictConversion)
        {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END)
            {
                --source; /* return to the illegal value itself */
                result = ConversionResult::sourceIllegal;
                break;
            }
        }
        /*
         * Figure out how many bytes the result will require. Turn any
         * illegally large UTF32 things (> Plane 17) into replacement chars.
         */
        if (ch < 0x80)
        {
            bytesToWrite = 1;
        }
        else if (ch < 0x800)
        {
            bytesToWrite = 2;
        }
        else if (ch < 0x10000)
        {
            bytesToWrite = 3;
        }
        else if (ch <= UNI_MAX_LEGAL_UTF32)
        {
            bytesToWrite = 4;
        }
        else
        {
            bytesToWrite = 3;
            ch = UNI_REPLACEMENT_CHAR;
            result = ConversionResult::sourceIllegal;
        }

        target += bytesToWrite;
        if (target > targetEnd)
        {
            --source; /* Back up source pointer! */
            target -= bytesToWrite;
            result = ConversionResult::targetExhausted;
            break;
        }
        switch (bytesToWrite)
        { /* note: everything falls through. */
        case 4:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 3:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 2:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 1:
            *--target = static_cast<UTF8>(ch | firstByteMark[bytesToWrite]);
            break;
        default:;
        }
        target += bytesToWrite;
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}